

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

void BayesianGameIdenticalPayoff::SaveTextFormat(BayesianGameIdenticalPayoff *bg,string *filename)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar3;
  size_t sVar4;
  undefined8 *puVar5;
  Index jtI;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  ofstream fp;
  stringstream ss;
  long local_3d0;
  long local_3c8;
  long local_3b0;
  filebuf local_3a8 [24];
  byte abStack_390 [216];
  ios_base local_2b8 [264];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::ofstream::ofstream(&local_3b0,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_390[*(long *)(local_3b0 + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"BayesianGameIdenticalPayoff::SaveTextFormat could not open ",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar5 = &PTR__E_0059bd80;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_3d0,local_3c8 + local_3d0);
    __cxa_throw(puVar5,&E::typeinfo,E::~E);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3b0,"# BayesianGameIdenticalPayoff text format.",0x2a);
  std::ios::widen((char)(ostream *)&local_3b0 + (char)*(undefined8 *)(local_3b0 + -0x18));
  std::ostream::put((char)&local_3b0);
  std::ostream::flush();
  (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_3b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar8 = 0;
  while( true ) {
    iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
    uVar7 = (ulong)uVar8;
    if (CONCAT44(extraout_var,iVar1) == uVar7) break;
    (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[4])(bg,uVar7);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_3b0);
    iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
    if (CONCAT44(extraout_var_00,iVar1) - 1U != uVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0," ",1);
    }
    uVar8 = uVar8 + 1;
  }
  std::ios::widen((char)(ostream *)&local_3b0 + (char)*(undefined8 *)(local_3b0 + -0x18));
  std::ostream::put((char)&local_3b0);
  std::ostream::flush();
  uVar8 = 0;
  while( true ) {
    iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
    uVar7 = (ulong)uVar8;
    if (CONCAT44(extraout_var_01,iVar1) == uVar7) {
      std::ios::widen((char)(ostream *)&local_3b0 + (char)*(undefined8 *)(local_3b0 + -0x18));
      std::ostream::put((char)&local_3b0);
      std::ostream::flush();
      *(undefined8 *)(local_3a8 + *(long *)(local_3b0 + -0x18)) = 0x10;
      uVar8 = 0;
      while( true ) {
        sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
        uVar7 = (ulong)uVar8;
        if (sVar3 == uVar7) break;
        (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0xd])(bg,uVar7);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa);
        sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
        if (sVar3 - 1 != uVar7) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0," ",1);
        }
        uVar8 = uVar8 + 1;
      }
      std::ios::widen((char)(ostream *)&local_3b0 + (char)*(undefined8 *)(local_3b0 + -0x18));
      cVar6 = (char)(ostream *)&local_3b0;
      std::ostream::put(cVar6);
      std::ostream::flush();
      sVar3 = 0;
      while( true ) {
        sVar4 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
        if (sVar4 == sVar3) break;
        uVar8 = 0;
        while( true ) {
          sVar4 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)bg);
          uVar7 = (ulong)uVar8;
          if (sVar4 <= uVar7) break;
          (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x10])(bg,sVar3,uVar7);
          std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
          sVar4 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)bg);
          if (sVar4 - 1 != uVar7) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0," ",1);
          }
          uVar8 = uVar8 + 1;
        }
        std::ios::widen((char)*(undefined8 *)(local_3b0 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        sVar3 = (size_t)((int)sVar3 + 1);
      }
      local_3b0 = _VTT;
      *(undefined8 *)(local_3a8 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
      std::filebuf::~filebuf(local_3a8);
      std::ios_base::~ios_base(local_2b8);
      return;
    }
    if ((ulong)((long)(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                      _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                      _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar7) break;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_3b0);
    iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
    if (CONCAT44(extraout_var_02,iVar1) - 1U != uVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0," ",1);
    }
    uVar8 = uVar8 + 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

void BayesianGameIdenticalPayoff::SaveTextFormat(const BayesianGameIdenticalPayoff &bg,
                                                 const string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "BayesianGameIdenticalPayoff::SaveTextFormat could not open "
           << filename;
        throw(E(ss.str()));
    }

    fp << "# BayesianGameIdenticalPayoff text format." << endl;
    fp << bg.GetNrAgents() << endl;
    for(Index i=0;i!=bg.GetNrAgents();++i)
    {
        fp << bg.GetNrActions(i);
        if(i!=(bg.GetNrAgents()-1))
            fp << " ";
    }
    fp << endl;
    for(Index i=0;i!=bg.GetNrAgents();++i)
    {
        fp << bg.GetNrTypes(i);
        if(i!=(bg.GetNrAgents()-1))
            fp << " ";
    }
    fp << endl;
    fp.precision(16);
    for(Index jtI=0;jtI!=bg.GetNrJointTypes();++jtI)
    {
        fp << bg.GetProbability(jtI);
        if(jtI!=(bg.GetNrJointTypes()-1))
            fp << " ";
    }
    fp << endl;
    for(Index jtI=0;jtI!=bg.GetNrJointTypes();++jtI)
    {
        for(Index jaI=0; jaI < bg.GetNrJointActions(); ++jaI)
        {
            fp << bg.GetUtility(jtI,jaI);
            if(jaI!=(bg.GetNrJointActions()-1))
                fp << " ";
        }
        fp << endl;
    }
}